

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

tuple<pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_std::error_code>
* __thiscall
pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::consume_normal_state
          (tuple<pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_std::error_code>
           *__return_storage_ptr__,string_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,char32_t code_point,appender *app)

{
  string *v;
  bool bVar1;
  int iVar2;
  error_category *peVar3;
  state sVar4;
  error_code eVar5;
  
  iVar2 = 0;
  peVar3 = (error_category *)std::_V2::system_category();
  if (code_point == L'\\') {
    sVar4 = escape_state;
  }
  else {
    if (code_point == L'\"') {
      if (app->high_surrogate_ == L'\0') {
        v = (app->result_).ptr_;
        if ((this->super_matcher<pstore::exchange::import_ns::callbacks>).field_0xc == '\x01') {
          eVar5 = exchange::import_ns::callbacks::key(&parser->callbacks_,v);
        }
        else {
          eVar5 = exchange::import_ns::callbacks::string_value(&parser->callbacks_,v);
        }
        peVar3 = eVar5._M_cat;
        iVar2 = eVar5._M_value;
        sVar4 = done_state;
        goto LAB_0012f9d7;
      }
      sVar4 = done_state;
    }
    else if ((uint)code_point < 0x20) {
      sVar4 = normal_char_state;
    }
    else {
      bVar1 = appender::append32(app,code_point);
      sVar4 = normal_char_state;
      iVar2 = 0;
      if (bVar1) goto LAB_0012f9d7;
    }
    peVar3 = get_error_category();
    iVar2 = 0xd;
  }
LAB_0012f9d7:
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_std::error_code>
  ).super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
  _M_head_impl._M_value = iVar2;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_std::error_code>
  ).super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
  _M_head_impl._M_cat = peVar3;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_std::error_code>
  ).
  super__Head_base<0UL,_pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_false>
  ._M_head_impl = sVar4;
  return __return_storage_ptr__;
}

Assistant:

auto string_matcher<Callbacks>::consume_normal_state (parser<Callbacks> & parser,
                                                                  char32_t code_point,
                                                                  appender & app)
                -> std::tuple<state, std::error_code> {
                state next_state = normal_char_state;
                std::error_code error;

                if (code_point == '"') {
                    if (app.has_high_surrogate ()) {
                        error = error_code::bad_unicode_code_point;
                    } else {
                        // Consume the closing quote character.
                        if (object_key_) {
                            error = parser.callbacks ().key (*app.result ());
                        } else {
                            error = parser.callbacks ().string_value (*app.result ());
                        }
                    }
                    next_state = done_state;
                } else if (code_point == '\\') {
                    next_state = escape_state;
                } else if (code_point <= 0x1F) {
                    // Control characters U+0000 through U+001F MUST be escaped.
                    error = error_code::bad_unicode_code_point;
                } else {
                    if (!app.append32 (code_point)) {
                        error = error_code::bad_unicode_code_point;
                    }
                }

                return std::make_tuple (next_state, error);
            }